

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O2

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* str::split(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *__return_storage_ptr__,string_view str,string_view delimiter)

{
  size_type sVar1;
  size_type __pos;
  undefined1 local_58 [8];
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  local_58 = (undefined1  [8])str._M_len;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_58 != (undefined1  [8])0x0) {
    __pos = 0;
    while( true ) {
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_58,
                         delimiter._M_str,__pos,delimiter._M_len);
      if (sVar1 == 0xffffffffffffffff) break;
      join_0x00000010_0x00000000_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_58,__pos,
                      sVar1 - __pos);
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&str_local._M_str);
      __pos = sVar1 + delimiter._M_len;
    }
    join_0x00000010_0x00000000_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   ((basic_string_view<char,_std::char_traits<char>_> *)local_58,__pos,
                    (long)local_58 - __pos);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&str_local._M_str);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string_view> split(std::string_view str, std::string_view delimiter) {
        std::vector<std::string_view> tokens;

        if (str.empty()) {
            return tokens;
        }

        size_t from = 0;
        size_t to = str.find(delimiter);

        while (to != std::string_view::npos) {
            tokens.push_back(str.substr(from, to - from));
            from = to + delimiter.length();
            to = str.find(delimiter, from);
        }

        tokens.push_back(str.substr(from, str.size() - from));
        return tokens;
    }